

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

int cimg_library::cimg::fread<long>(long *ptr,uint nmemb,FILE *stream)

{
  int iVar1;
  CImgArgumentException *this;
  char *pcVar2;
  size_t sVar3;
  FILE *in_RDX;
  uint in_ESI;
  long in_RDI;
  char *pcVar4;
  uint l_al_read;
  uint l_to_read;
  uint al_read;
  uint to_read;
  unsigned_long wlimit;
  unsigned_long wlimitT;
  bool local_69;
  size_t local_68;
  uint local_40;
  uint local_3c;
  
  if (((in_RDI != 0) && (in_ESI != 0)) && (in_RDX != (FILE *)0x0)) {
    local_40 = 0;
    local_3c = in_ESI;
    do {
      if ((ulong)local_3c << 3 < 0x3f00000) {
        local_68 = (size_t)local_3c;
      }
      else {
        local_68 = 0x7e0000;
      }
      sVar3 = fread((void *)(in_RDI + (ulong)local_40 * 8),8,local_68,in_RDX);
      iVar1 = (int)sVar3;
      local_40 = iVar1 + local_40;
      local_3c = local_3c - iVar1;
      local_69 = (int)local_68 == iVar1 && local_3c != 0;
    } while (local_69);
    if (local_3c != 0) {
      warn("cimg::fread() : Only %u/%u elements could be read from file.",(ulong)local_40,
           (ulong)in_ESI);
    }
    return local_40;
  }
  this = (CImgArgumentException *)__cxa_allocate_exception(0x4008);
  pcVar2 = type<long>::string();
  pcVar4 = "";
  if (1 < in_ESI) {
    pcVar4 = "s";
  }
  CImgArgumentException::CImgArgumentException
            (this,"cimg::fread() : Invalid reading request of %u %s%s from file %p to buffer %p.",
             (ulong)in_ESI,pcVar2,pcVar4,in_RDX,in_RDI);
  __cxa_throw(this,&CImgArgumentException::typeinfo,CImgArgumentException::~CImgArgumentException);
}

Assistant:

inline int fread(T *const ptr, const unsigned int nmemb, std::FILE *stream) {
      if (!ptr || nmemb<=0 || !stream)
        throw CImgArgumentException("cimg::fread() : Invalid reading request of %u %s%s from file %p to buffer %p.",
                                    nmemb,cimg::type<T>::string(),nmemb>1?"s":"",stream,ptr);

      const unsigned long wlimitT = 63*1024*1024, wlimit = wlimitT/sizeof(T);
      unsigned int to_read = nmemb, al_read = 0, l_to_read = 0, l_al_read = 0;
      do {
        l_to_read = (to_read*sizeof(T))<wlimitT?to_read:wlimit;
        l_al_read = (unsigned int)std::fread((void*)(ptr+al_read),sizeof(T),l_to_read,stream);
        al_read+=l_al_read;
        to_read-=l_al_read;
      } while (l_to_read==l_al_read && to_read>0);
      if (to_read>0)
        warn("cimg::fread() : Only %u/%u elements could be read from file.",
             al_read,nmemb);
      return al_read;
    }